

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::CleanCoverageLogFiles(cmCTestCoverageHandler *this,ostream *log)

{
  cmCTest *this_00;
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ostream *poVar3;
  string *f;
  pointer source;
  string logGlob;
  Glob gl;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  Glob local_80;
  
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"BuildDirectory",&local_e1)
  ;
  cmCTest::GetCTestConfiguration((string *)&local_80,this_00,&local_c0);
  cmCTest::GetCurrentTag_abi_cxx11_(&local_e0,(this->super_cmCTestGenericHandler).CTest);
  cmStrCat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[14]>
            (&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
             (char (*) [10])"/Testing/",&local_e0,(char (*) [14])"/CoverageLog*");
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  cmsys::Glob::Glob(&local_80);
  cmsys::Glob::FindFiles(&local_80,&local_a0,(GlobMessages *)0x0);
  pvVar2 = cmsys::Glob::GetFiles_abi_cxx11_(&local_80);
  pbVar1 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (source = (pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; source != pbVar1; source = source + 1) {
    poVar3 = std::operator<<(log,"Removing old coverage log: ");
    poVar3 = std::operator<<(poVar3,(string *)source);
    std::operator<<(poVar3,"\n");
    cmsys::SystemTools::RemoveFile(source);
  }
  cmsys::Glob::~Glob(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void cmCTestCoverageHandler::CleanCoverageLogFiles(std::ostream& log)
{
  std::string logGlob =
    cmStrCat(this->CTest->GetCTestConfiguration("BuildDirectory"), "/Testing/",
             this->CTest->GetCurrentTag(), "/CoverageLog*");
  cmsys::Glob gl;
  gl.FindFiles(logGlob);
  std::vector<std::string> const& files = gl.GetFiles();
  for (std::string const& f : files) {
    log << "Removing old coverage log: " << f << "\n";
    cmSystemTools::RemoveFile(f);
  }
}